

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dedma_back.c
# Opt level: O1

void parse_renouveau_startup(state *s,char *path)

{
  FILE *__stream;
  char *buf;
  char *local_18;
  
  local_18 = (char *)0x0;
  asprintf(&local_18,"%s/card_%04x-%04x_test_startup.txt",path,(ulong)(s->pci_id >> 0x10),
           (ulong)(s->pci_id & 0xffff));
  __stream = fopen(local_18,"r");
  if (__stream == (FILE *)0x0) {
    parse_renouveau_startup_cold_1();
  }
  else {
    dedma(s,(FILE *)__stream,true);
    fclose(__stream);
  }
  free(local_18);
  return;
}

Assistant:

void
parse_renouveau_startup(struct state *s, char *path)
{
	char *buf = NULL;
	FILE *f;

	asprintf(&buf, "%s/card_%04x-%04x_test_startup.txt", path,
		 s->pci_id >> 16, s->pci_id & 0xffff);
	f = fopen(buf, "r");
	if (!f) {
		fprintf(stderr, "Couldn't open %s: %s\n", buf,
			strerror(errno));
		goto out;
	}

	dedma(s, f, true);

	fclose(f);
out:
	free(buf);
}